

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void plot_bitmap(tgestate_t *state,uint8_t *src,uint8_t *dst,uint8_t width,uint8_t height)

{
  byte in_CL;
  uint8_t *in_RDX;
  void *in_RSI;
  tgestate_t *in_RDI;
  char in_R8B;
  uint8_t *curr_dst;
  undefined6 in_stack_00000008;
  uint8_t h;
  undefined8 local_28;
  undefined1 local_1b;
  undefined8 local_10;
  
  local_28 = in_RDX;
  local_1b = in_R8B;
  local_10 = in_RSI;
  do {
    memcpy(local_28,local_10,(ulong)in_CL);
    local_10 = (void *)((long)local_10 + (long)(int)(uint)in_CL);
    local_28 = get_next_scanline(in_RDI,local_28);
    local_1b = local_1b + -1;
  } while (local_1b != '\0');
  invalidate_bitmap((tgestate_t *)dst,(uint8_t *)CONCAT17(width,CONCAT16(height,in_stack_00000008)),
                    curr_dst._4_4_,(int)curr_dst);
  return;
}

Assistant:

void plot_bitmap(tgestate_t    *state,
                 const uint8_t *src,
                 uint8_t       *dst,
                 uint8_t        width,
                 uint8_t        height)
{
  uint8_t  h;
  uint8_t *curr_dst;

  assert(state != NULL);
  assert(src   != NULL);
  assert(dst   != NULL);
  assert(width  > 0);
  assert(height > 0);

  h        = height;
  curr_dst = dst;
  do
  {
    memcpy(curr_dst, src, width);
    src += width;
    curr_dst = get_next_scanline(state, curr_dst);
  }
  while (--h);

  /* Conv: Invalidation added over the original game. */
  invalidate_bitmap(state, dst, width * 8, height);
}